

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O0

void av1_highbd_fwd_txfm(int16_t *src_diff,tran_low_t *coeff,int diff_stride,TxfmParam *txfm_param)

{
  undefined1 uVar1;
  int16_t *in_RCX;
  undefined4 in_EDX;
  int16_t *in_RSI;
  TX_SIZE tx_size;
  TxfmParam *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  int diff_stride_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = *(undefined1 *)((long)in_RCX + 1);
  diff_stride_00 = (int)((ulong)in_RCX >> 0x20);
  switch(uVar1) {
  case 0:
    highbd_fwd_txfm_4x4(in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                        diff_stride_00,(TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 1:
    highbd_fwd_txfm_8x8(in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                        diff_stride_00,(TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 2:
    highbd_fwd_txfm_16x16
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 3:
    highbd_fwd_txfm_32x32
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 4:
    highbd_fwd_txfm_64x64
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 5:
    highbd_fwd_txfm_4x8(in_RCX,(tran_low_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
                        in_stack_ffffffffffffffc8);
    break;
  case 6:
    highbd_fwd_txfm_8x4(in_RCX,(tran_low_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
                        in_stack_ffffffffffffffc8);
    break;
  case 7:
    highbd_fwd_txfm_8x16
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 8:
    highbd_fwd_txfm_16x8
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 9:
    highbd_fwd_txfm_16x32
              (in_RCX,(tran_low_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 10:
    highbd_fwd_txfm_32x16
              (in_RCX,(tran_low_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0xb:
    highbd_fwd_txfm_32x64
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 0xc:
    highbd_fwd_txfm_64x32
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 0xd:
    highbd_fwd_txfm_4x16
              (in_RCX,(tran_low_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0xe:
    highbd_fwd_txfm_16x4
              (in_RCX,(tran_low_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0xf:
    highbd_fwd_txfm_8x32
              (in_RCX,(tran_low_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0x10:
    highbd_fwd_txfm_32x8
              (in_RCX,(tran_low_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0x11:
    highbd_fwd_txfm_16x64
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 0x12:
    highbd_fwd_txfm_64x16
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),diff_stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void av1_highbd_fwd_txfm(const int16_t *src_diff, tran_low_t *coeff,
                         int diff_stride, TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_64X64:
      highbd_fwd_txfm_64x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X64:
      highbd_fwd_txfm_32x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_64X32:
      highbd_fwd_txfm_64x32(src_diff, coeff, diff_stride, txfm_param);
      break;

    case TX_32X32:
      highbd_fwd_txfm_32x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X16:
      highbd_fwd_txfm_16x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X8:
      highbd_fwd_txfm_8x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_4X8:
      highbd_fwd_txfm_4x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X4:
      highbd_fwd_txfm_8x4(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X16:
      highbd_fwd_txfm_8x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X8:
      highbd_fwd_txfm_16x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X32:
      highbd_fwd_txfm_16x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X16:
      highbd_fwd_txfm_32x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_4X4:
      highbd_fwd_txfm_4x4(src_diff, coeff, diff_stride, txfm_param);
      break;
#if !CONFIG_REALTIME_ONLY
    case TX_4X16:
      highbd_fwd_txfm_4x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X4:
      highbd_fwd_txfm_16x4(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X32:
      highbd_fwd_txfm_8x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X8:
      highbd_fwd_txfm_32x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X64:
      highbd_fwd_txfm_16x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_64X16:
      highbd_fwd_txfm_64x16(src_diff, coeff, diff_stride, txfm_param);
      break;
#endif
    default: assert(0); break;
  }
}